

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.hh
# Opt level: O0

void __thiscall Pl_AES_PDF::~Pl_AES_PDF(Pl_AES_PDF *this)

{
  Pl_AES_PDF *this_local;
  
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&this->key);
  std::shared_ptr<QPDFCryptoImpl>::~shared_ptr(&this->crypto);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_AES_PDF() final = default;